

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void google::protobuf::internal::MapFieldBase::UnsafeShallowSwapImpl
               (MapFieldBase *lhs,MapFieldBase *rhs)

{
  TaggedPtr TVar1;
  string *psVar2;
  Arena *local_30 [2];
  Arena *local_20;
  
  local_30[0] = arena(lhs);
  local_20 = arena(rhs);
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                     (local_30,&local_20,"lhs.arena() == rhs.arena()");
  if (psVar2 == (string *)0x0) {
    TVar1 = (rhs->payload_)._M_i;
    (rhs->payload_)._M_i = (lhs->payload_)._M_i;
    (lhs->payload_)._M_i = TVar1;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map_field.cc"
             ,0x91,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

void MapFieldBase::UnsafeShallowSwapImpl(MapFieldBase& lhs, MapFieldBase& rhs) {
  ABSL_DCHECK_EQ(lhs.arena(), rhs.arena());
  lhs.InternalSwap(&rhs);
}